

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

auto_fft_object auto_fft_init(int N)

{
  int iVar1;
  auto_fft_object paVar2;
  fft_real_object pfVar3;
  auto_fft_object obj;
  int N_local;
  
  paVar2 = (auto_fft_object)malloc(0x18);
  iVar1 = findnexte(N << 1);
  paVar2->clen = iVar1;
  paVar2->ilen = N;
  pfVar3 = fft_real_init(paVar2->clen,1);
  paVar2->fobj = pfVar3;
  pfVar3 = fft_real_init(paVar2->clen,-1);
  paVar2->iobj = pfVar3;
  return paVar2;
}

Assistant:

auto_fft_object auto_fft_init(int N) {
	auto_fft_object obj = NULL;

		
	obj = (auto_fft_object) malloc (sizeof(struct auto_set));
	 
	//obj->clen = npow2(conv_len);
	//obj->clen = conv_len;
	obj->clen = findnexte(2*N);
	//obj->clen = 125;
	obj->ilen = N;
	
	obj->fobj = fft_real_init(obj->clen,1);
	obj->iobj = fft_real_init(obj->clen,-1);
	
	return obj;
}